

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O1

_Bool trans_srli(DisasContext_conflict12 *ctx,arg_srli *a)

{
  int iVar1;
  TCGContext_conflict11 *s;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 a2;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  iVar1 = a->shamt;
  if ((0x3f < iVar1) || (a->rd == 0)) goto LAB_00c79de7;
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
LAB_00c79d9a:
    tcg_gen_op2_riscv64(s,opc,(TCGArg)a1,(TCGArg)a2);
  }
  else if (s->cpu_gpr[a->rs1] != ret) {
    a2 = s->cpu_gpr[a->rs1] + (long)s;
    opc = INDEX_op_mov_i64;
    goto LAB_00c79d9a;
  }
  tcg_gen_shri_i64_riscv64(s,ret,ret,(long)a->shamt);
  if (((long)a->rd != 0) && (s->cpu_gpr[a->rd] != ret)) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[a->rd] + (long)s),(TCGArg)a1);
  }
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(ret + (long)s));
LAB_00c79de7:
  return iVar1 < 0x40;
}

Assistant:

static bool trans_srli(DisasContext *ctx, arg_srli *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (a->shamt >= TARGET_LONG_BITS) {
        return false;
    }

    if (a->rd != 0) {
        TCGv t = tcg_temp_new(tcg_ctx);
        gen_get_gpr(tcg_ctx, t, a->rs1);

        tcg_gen_shri_tl(tcg_ctx, t, t, a->shamt);
        gen_set_gpr(tcg_ctx, a->rd, t);
        tcg_temp_free(tcg_ctx, t);
    } /* NOP otherwise */
    return true;
}